

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.h
# Opt level: O2

void __thiscall
bwtil::HuffmanTree<unsigned_long>::storeTree
          (HuffmanTree<unsigned_long> *this,vector<bool,_std::allocator<bool>_> *code,Node n,
          vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
          *nodes_vec)

{
  Node n_00;
  Node n_01;
  reference pvVar1;
  _Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  local_148;
  _Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  local_130;
  vector<bool,_std::allocator<bool>_> coder;
  vector<bool,_std::allocator<bool>_> codel;
  _Bvector_base<std::allocator<bool>_> local_c8;
  _Bvector_base<std::allocator<bool>_> local_a0;
  unsigned_long uStack_78;
  ulint uStack_70;
  unsigned_long local_68;
  undefined8 uStack_60;
  unsigned_long uStack_58;
  unsigned_long uStack_50;
  unsigned_long uStack_48;
  ulint uStack_40;
  unsigned_long local_38;
  undefined8 uStack_30;
  unsigned_long uStack_28;
  unsigned_long uStack_20;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&codel,code);
  std::vector<bool,_std::allocator<bool>_>::vector(&coder,code);
  std::vector<bool,_std::allocator<bool>_>::push_back(&codel,false);
  std::vector<bool,_std::allocator<bool>_>::push_back(&coder,true);
  if (n.leaf_left == true) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((this->codes).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + n.left,&codel);
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_a0,&codel);
    pvVar1 = std::
             vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
             ::at(nodes_vec,n.left);
    uStack_48 = pvVar1->node_number;
    uStack_40 = pvVar1->freq;
    local_38 = pvVar1->label;
    uStack_30._0_1_ = pvVar1->leaf;
    uStack_30._1_1_ = pvVar1->leaf_left;
    uStack_30._2_1_ = pvVar1->leaf_right;
    uStack_30._3_5_ = *(undefined5 *)&pvVar1->field_0x1b;
    uStack_28 = pvVar1->left;
    uStack_20 = pvVar1->right;
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::vector((vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
              *)&local_130,nodes_vec);
    n_00.freq = uStack_40;
    n_00.node_number = uStack_48;
    n_00.label = local_38;
    n_00.leaf = (bool)(undefined1)uStack_30;
    n_00.leaf_left = (bool)uStack_30._1_1_;
    n_00.leaf_right = (bool)uStack_30._2_1_;
    n_00._27_5_ = uStack_30._3_5_;
    n_00.left = uStack_28;
    n_00.right = uStack_20;
    storeTree(this,(vector<bool,_std::allocator<bool>_> *)&local_a0,n_00,
              (vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
               *)&local_130);
    std::
    _Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::~_Vector_base(&local_130);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_a0);
  }
  if (n.leaf_right == true) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((this->codes).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + n.right,&coder);
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_c8,&coder);
    pvVar1 = std::
             vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
             ::at(nodes_vec,n.right);
    uStack_78 = pvVar1->node_number;
    uStack_70 = pvVar1->freq;
    local_68 = pvVar1->label;
    uStack_60._0_1_ = pvVar1->leaf;
    uStack_60._1_1_ = pvVar1->leaf_left;
    uStack_60._2_1_ = pvVar1->leaf_right;
    uStack_60._3_5_ = *(undefined5 *)&pvVar1->field_0x1b;
    uStack_58 = pvVar1->left;
    uStack_50 = pvVar1->right;
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::vector((vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
              *)&local_148,nodes_vec);
    n_01.freq = uStack_70;
    n_01.node_number = uStack_78;
    n_01.label = local_68;
    n_01.leaf = (bool)(undefined1)uStack_60;
    n_01.leaf_left = (bool)uStack_60._1_1_;
    n_01.leaf_right = (bool)uStack_60._2_1_;
    n_01._27_5_ = uStack_60._3_5_;
    n_01.left = uStack_58;
    n_01.right = uStack_50;
    storeTree(this,(vector<bool,_std::allocator<bool>_> *)&local_c8,n_01,
              (vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
               *)&local_148);
    std::
    _Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::~_Vector_base(&local_148);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_c8);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&coder.super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&codel.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

void storeTree(vector<bool> code, Node n,vector<Node> nodes_vec){

		vector<bool> codel = code;
		vector<bool> coder = code;

		codel.push_back(0);
		coder.push_back(1);

		//T node_nr = n.node_number;

		if(n.leaf_left){//leaf

			codes[n.left] = codel;
			//left_leafs.at(node_nr) = true;
			//left[node_nr] = n.left;

		}else{

			//left_leafs.at(node_nr) = false;
			//left[node_nr] = n.left;

			storeTree(codel,nodes_vec.at(n.left), nodes_vec);

		}

		if(n.leaf_right){//leaf

			codes[n.right] = coder;
			//right_leafs.at(node_nr) = true;
			//right[node_nr] = n.right;

		}else{

			//right_leafs.at(node_nr) = false;
			//right[node_nr] = n.right;

			storeTree(coder,nodes_vec.at(n.right), nodes_vec);

		}

	}